

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O3

void __thiscall tvm::runtime::FunctionInfo::Save(FunctionInfo *this,JSONWriter *writer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator __position;
  pointer paVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  ulong uVar4;
  long lVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sarg_types;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,
           (long)(this->arg_types).super__Vector_base<DLDataType,_std::allocator<DLDataType>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->arg_types).super__Vector_base<DLDataType,_std::allocator<DLDataType>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_68);
  paVar2 = (this->arg_types).super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->arg_types).super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl.
      super__Vector_impl_data._M_finish != paVar2) {
    lVar5 = 0;
    uVar4 = 0;
    uVar3 = extraout_RDX;
    do {
      TVMType2String_abi_cxx11_(&local_68,(runtime *)(ulong)(uint)paVar2[uVar4],SUB84(uVar3,0));
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&((local_48.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5),
                 (string *)&local_68);
      uVar3 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        uVar3 = extraout_RDX_01;
      }
      uVar4 = uVar4 + 1;
      paVar2 = (this->arg_types).super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl
               .super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x20;
    } while (uVar4 < (ulong)((long)(this->arg_types).
                                   super__Vector_base<DLDataType,_std::allocator<DLDataType>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)paVar2 >> 2));
  }
  local_68._M_dataplus._M_p._0_1_ = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(writer->os_,(char *)&local_68,1);
  std::vector<bool,_std::allocator<bool>_>::push_back(&writer->scope_multi_line_,true);
  local_68._M_dataplus._M_p = (pointer)0x0;
  __position._M_current =
       (writer->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (writer->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&writer->scope_counter_,__position,(unsigned_long *)&local_68);
  }
  else {
    *__position._M_current = 0;
    (writer->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"name","");
  dmlc::JSONWriter::WriteObjectKeyValue<std::__cxx11::string>(writer,&local_68,&this->name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"arg_types","");
  dmlc::JSONWriter::
  WriteObjectKeyValue<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (writer,&local_68,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"thread_axis_tags","");
  dmlc::JSONWriter::
  WriteObjectKeyValue<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (writer,&local_68,&this->thread_axis_tags);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  dmlc::JSONWriter::EndObject(writer);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void FunctionInfo::Save(dmlc::JSONWriter *writer) const {
  std::vector<std::string> sarg_types(arg_types.size());
  for (size_t i = 0; i < arg_types.size(); ++i) {
    sarg_types[i] = TVMType2String(arg_types[i]);
  }
  writer->BeginObject();
  writer->WriteObjectKeyValue("name", name);
  writer->WriteObjectKeyValue("arg_types", sarg_types);
  writer->WriteObjectKeyValue("thread_axis_tags", thread_axis_tags);
  writer->EndObject();
}